

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::PushClipRect
          (ImDrawList *this,ImVec2 cr_min,ImVec2 cr_max,bool intersect_with_current_clip_rect)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float fVar4;
  ImVec2 IVar5;
  ImVec4 *pIVar6;
  ImGuiContext *pIVar7;
  int iVar8;
  int iVar9;
  undefined7 in_register_00000031;
  ImVec4 *pIVar10;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float local_48;
  float local_38;
  ImVec2 local_28;
  
  pIVar7 = GImGui;
  local_38 = cr_max.x;
  local_48 = cr_max.y;
  local_28.x = cr_min.x;
  local_28.y = cr_min.y;
  iVar8 = (this->_ClipRectStack).Size;
  fVar11 = local_48;
  IVar5 = cr_min;
  if ((int)CONCAT71(in_register_00000031,intersect_with_current_clip_rect) == 0) {
LAB_00132a34:
    local_28 = IVar5;
    local_48 = fVar11;
    if (iVar8 != (this->_ClipRectStack).Capacity) {
LAB_00132a64:
      pIVar6 = (this->_ClipRectStack).Data;
      goto LAB_00132aff;
    }
    if (iVar8 == 0) {
      iVar8 = 8;
      iVar9 = 1;
    }
    else {
      iVar9 = iVar8 + 1;
      iVar8 = iVar8 / 2 + iVar8;
    }
  }
  else {
    if (iVar8 != 0) {
      pIVar6 = (this->_ClipRectStack).Data;
      uVar2 = pIVar6[(long)iVar8 + -1].x;
      uVar3 = pIVar6[(long)iVar8 + -1].y;
      auVar12._4_4_ = uVar3;
      auVar12._0_4_ = uVar2;
      auVar12._8_8_ = 0;
      auVar13._8_4_ = in_XMM0_Dc;
      auVar13._0_8_ = cr_min;
      auVar13._12_4_ = in_XMM0_Dd;
      auVar13 = maxps(auVar12,auVar13);
      fVar4 = pIVar6[(long)iVar8 + -1].z;
      if (local_38 <= pIVar6[(long)iVar8 + -1].z) {
        fVar4 = local_38;
      }
      fVar11 = pIVar6[(long)iVar8 + -1].w;
      IVar5 = auVar13._0_8_;
      local_38 = fVar4;
      if (local_48 <= pIVar6[(long)iVar8 + -1].w) {
        fVar11 = local_48;
      }
      goto LAB_00132a34;
    }
    iVar8 = 0;
    if ((this->_ClipRectStack).Capacity != 0) goto LAB_00132a64;
    iVar8 = 8;
    iVar9 = 1;
    local_28 = cr_min;
  }
  if (iVar9 < iVar8) {
    iVar9 = iVar8;
  }
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  pIVar6 = (ImVec4 *)(*(pIVar7->IO).MemAllocFn)((long)iVar9 << 4);
  pIVar10 = (this->_ClipRectStack).Data;
  if (pIVar10 == (ImVec4 *)0x0) {
LAB_00132adf:
    pIVar10 = (ImVec4 *)0x0;
    pIVar7 = GImGui;
  }
  else {
    memcpy(pIVar6,pIVar10,(long)(this->_ClipRectStack).Size << 4);
    pIVar7 = GImGui;
    pIVar10 = (this->_ClipRectStack).Data;
    if (pIVar10 == (ImVec4 *)0x0) goto LAB_00132adf;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar7->IO).MemFreeFn)(pIVar10);
  (this->_ClipRectStack).Data = pIVar6;
  (this->_ClipRectStack).Capacity = iVar9;
  iVar8 = (this->_ClipRectStack).Size;
LAB_00132aff:
  (this->_ClipRectStack).Size = iVar8 + 1;
  pIVar6[iVar8].x = local_28.x;
  pIVar6[iVar8].y = local_28.y;
  pIVar6[iVar8].z =
       (float)(~-(uint)(local_38 <= local_28.x) & (uint)local_38 |
              -(uint)(local_38 <= local_28.x) & (uint)local_28.x);
  pIVar6[iVar8].w =
       (float)(~-(uint)(local_48 <= local_28.y) & (uint)local_48 |
              (uint)local_28.y & -(uint)(local_48 <= local_28.y));
  UpdateClipRect(this);
  return;
}

Assistant:

void ImDrawList::PushClipRect(ImVec2 cr_min, ImVec2 cr_max, bool intersect_with_current_clip_rect)
{
    ImVec4 cr(cr_min.x, cr_min.y, cr_max.x, cr_max.y);
    if (intersect_with_current_clip_rect && _ClipRectStack.Size)
    {
        ImVec4 current = _ClipRectStack.Data[_ClipRectStack.Size-1];
        if (cr.x < current.x) cr.x = current.x;
        if (cr.y < current.y) cr.y = current.y;
        if (cr.z > current.z) cr.z = current.z;
        if (cr.w > current.w) cr.w = current.w;
    }
    cr.z = ImMax(cr.x, cr.z);
    cr.w = ImMax(cr.y, cr.w);

    _ClipRectStack.push_back(cr);
    UpdateClipRect();
}